

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_transaction.cpp
# Opt level: O1

void __thiscall
duckdb::CatalogTransaction::CatalogTransaction
          (CatalogTransaction *this,Catalog *catalog,ClientContext *context)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  Transaction *pTVar4;
  DatabaseInstance *pDVar5;
  DuckTransaction *dtransaction;
  undefined1 auVar6 [16];
  
  this->db = (DatabaseInstance *)0x0;
  this->context = (ClientContext *)0x0;
  (this->transaction).ptr = (Transaction *)0x0;
  pTVar4 = Transaction::Get(context,catalog);
  pDVar5 = DatabaseInstance::GetDatabase(context);
  (this->db).ptr = pDVar5;
  iVar3 = (*pTVar4->_vptr_Transaction[3])(pTVar4);
  if ((char)iVar3 == '\0') {
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
  }
  else {
    uVar1 = pTVar4[1]._vptr_Transaction;
    uVar2 = pTVar4[1].manager;
    auVar6._8_4_ = (int)uVar1;
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = (int)((ulong)uVar1 >> 0x20);
  }
  this->transaction_id = auVar6._0_8_;
  this->start_time = auVar6._8_8_;
  (this->transaction).ptr = pTVar4;
  (this->context).ptr = context;
  return;
}

Assistant:

CatalogTransaction::CatalogTransaction(Catalog &catalog, ClientContext &context) {
	auto &transaction = Transaction::Get(context, catalog);
	this->db = &DatabaseInstance::GetDatabase(context);
	if (!transaction.IsDuckTransaction()) {
		this->transaction_id = transaction_t(-1);
		this->start_time = transaction_t(-1);
	} else {
		auto &dtransaction = transaction.Cast<DuckTransaction>();
		this->transaction_id = dtransaction.transaction_id;
		this->start_time = dtransaction.start_time;
	}
	this->transaction = &transaction;
	this->context = &context;
}